

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

void sq_settop(HSQUIRRELVM v,SQInteger newtop)

{
  long lVar1;
  long n;
  bool bVar2;
  
  lVar1 = v->_top - v->_stackbase;
  n = lVar1 - newtop;
  if (n != 0 && newtop <= lVar1) {
    SQVM::Pop(v,n);
    return;
  }
  lVar1 = (v->_stackbase + newtop) - v->_top;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    SQVM::PushNull(v);
  }
  return;
}

Assistant:

void sq_settop(HSQUIRRELVM v, SQInteger newtop)
{
    SQInteger top = sq_gettop(v);
    if(top > newtop)
        sq_pop(v, top - newtop);
    else
        while(top++ < newtop) sq_pushnull(v);
}